

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::mouseDoubleClickEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  bool bVar1;
  MouseButton MVar2;
  QFlagsStorage<Qt::WindowType> QVar3;
  Int IVar4;
  QObject *pQVar5;
  QMdiSubWindowPrivate *this_00;
  int __fd;
  QSinglePointEvent *in_RSI;
  QSinglePointEvent *pQVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *d;
  WindowFlags flags;
  undefined4 in_stack_ffffffffffffffb8;
  WindowType in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffe0;
  QFlagsStorageHelper<Qt::WindowType,_4> local_18;
  QFlagsStorageHelper<Qt::WindowType,_4> local_14;
  QFlagsStorageHelper<Qt::WindowType,_4> local_10;
  QFlagsStorageHelper<Qt::WindowType,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RSI;
  pQVar5 = QObject::parent((QObject *)0x6361bf);
  __fd = (int)pQVar6;
  if (pQVar5 == (QObject *)0x0) {
    QWidget::mouseDoubleClickEvent
              (in_RDI,(QMouseEvent *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    goto LAB_0063636d;
  }
  MVar2 = QSinglePointEvent::button(in_RSI);
  if (MVar2 != LeftButton) {
    QEvent::ignore((QEvent *)in_RSI);
    goto LAB_0063636d;
  }
  this_00 = d_func((QMdiSubWindow *)0x636201);
  bVar1 = QMdiSubWindowPrivate::isMoveOperation(this_00);
  if (!bVar1) {
    if (this_00->hoveredSubControl == SC_ComboBoxFrame) {
      QWidget::close(in_RDI,__fd);
    }
    goto LAB_0063636d;
  }
  local_c.super_QFlagsStorage<Qt::WindowType>.i = (QFlagsStorage<Qt::WindowType>)0xaaaaaaaa;
  local_c.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)QWidget::windowFlags(in_RDI);
  bVar1 = QWidget::isMinimized(in_RDI);
  if (!bVar1) {
    bVar1 = QWidget::isMaximized(in_RDI);
    if (bVar1) {
      local_18.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffbc);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
      if (IVar4 != 0) {
        QWidget::showNormal((QWidget *)this_00);
      }
    }
    else {
      QVar3.i = (Int)QFlags<Qt::WindowType>::operator&
                               ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffbc);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffe4);
      if (IVar4 == 0) {
        QFlags<Qt::WindowType>::operator&
                  ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffbc);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffe0);
        if (IVar4 != 0) {
          QWidget::showMaximized((QWidget *)this_00);
        }
      }
      else {
        showShaded((QMdiSubWindow *)CONCAT44(QVar3.i,in_stack_ffffffffffffffe0));
      }
    }
    goto LAB_0063636d;
  }
  bVar1 = isShaded((QMdiSubWindow *)0x636263);
  if (bVar1) {
    local_10.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffbc);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
    in_stack_ffffffffffffffbc = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
    if (IVar4 == 0) goto LAB_00636293;
  }
  else {
LAB_00636293:
    local_14.super_QFlagsStorage<Qt::WindowType>.i =
         (QFlagsStorage<Qt::WindowType>)
         QFlags<Qt::WindowType>::operator&
                   ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffbc);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    in_stack_ffffffffffffffbc = (uint)(IVar4 != 0) << 0x18;
  }
  if ((char)(in_stack_ffffffffffffffbc >> 0x18) != '\0') {
    QWidget::showNormal((QWidget *)this_00);
  }
LAB_0063636d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::mouseDoubleClickEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseDoubleClickEvent(mouseEvent);
        return;
    }

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    Q_D(QMdiSubWindow);
    if (!d->isMoveOperation()) {
#if QT_CONFIG(menu)
        if (d->hoveredSubControl == QStyle::SC_TitleBarSysMenu)
            close();
#endif
        return;
    }

    Qt::WindowFlags flags = windowFlags();
    if (isMinimized()) {
        if ((isShaded() && (flags & Qt::WindowShadeButtonHint))
            || (flags & Qt::WindowMinimizeButtonHint)) {
            showNormal();
        }
        return;
    }

    if (isMaximized()) {
       if (flags & Qt::WindowMaximizeButtonHint)
           showNormal();
       return;
    }

    if (flags & Qt::WindowShadeButtonHint)
        showShaded();
    else if (flags & Qt::WindowMaximizeButtonHint)
        showMaximized();
}